

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkFFT.c
# Opt level: O2

void write_to_child_process(int (*pipes) [2],int numberAmount,complex *numbers)

{
  size_t __n;
  undefined8 *puVar1;
  ulong uVar2;
  ulong uVar3;
  char floatToString [100000];
  char acStack_186d8 [100008];
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)numberAmount;
  if (numberAmount < 1) {
    uVar3 = uVar2;
  }
  puVar1 = (undefined8 *)(*numbers + 8);
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    snprintf(acStack_186d8,100000,"%.5f %.5f*i\n",puVar1[-1],*puVar1);
    __n = strlen(acStack_186d8);
    write(pipes[(uint)uVar2 & 1][1],acStack_186d8,__n);
    puVar1 = puVar1 + 2;
  }
  return;
}

Assistant:

static void write_to_child_process(int pipes[4][2], int numberAmount, const double complex *numbers)
{
    char floatToString[MAXLENGTH]; //string that will be written to the pipe

    for (int i = 0; i < numberAmount; i++)
    {

        snprintf(floatToString, sizeof(floatToString), "%.5f %.5f*i\n", creal(numbers[i]), cimag(numbers[i]));
        if (i % 2 == 1)
            write(pipes[PIPE_O_WRITE][WRITE], floatToString, (strlen(floatToString)));
        else
            write(pipes[PIPE_E_WRITE][WRITE], floatToString, (strlen(floatToString)));
    }
}